

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_374d6::TestValidCheckSucceeds::RunImpl(TestValidCheckSucceeds *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_48;
  undefined1 local_11;
  TestValidCheckSucceeds *pTStack_10;
  bool b;
  TestValidCheckSucceeds *this_local;
  
  local_11 = 1;
  pTStack_10 = this;
  bVar1 = UnitTest::Check<bool>(true);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_48,*ppTVar3,0xe);
    UnitTest::TestResults::OnTestFailure(this_00,&local_48,"b");
  }
  return;
}

Assistant:

TEST(ValidCheckSucceeds)
{
    bool const b = true;
    CHECK(b);
}